

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatClone(SUNMatrix A,int myid)

{
  int iVar1;
  SUNMatrix A_00;
  double dVar2;
  double dVar3;
  SUNMatrix B;
  realtype tol;
  double stop_time;
  double start_time;
  int failure;
  int myid_local;
  SUNMatrix A_local;
  
  dVar2 = get_time();
  A_00 = SUNMatClone(A);
  dVar3 = get_time();
  if (A_00 == (SUNMatrix)0x0) {
    printf(">>> FAILED test -- SUNMatClone, Proc %d \n",(ulong)(uint)myid);
    printf("    After SUNMatClone, B == NULL \n \n");
    A_local._4_4_ = 1;
  }
  else {
    iVar1 = has_data(A_00);
    if (iVar1 == 0) {
      printf(">>> FAILED test -- SUNMatClone, Proc %d \n",(ulong)(uint)myid);
      printf("    Matrix data == NULL \n \n");
      SUNMatDestroy(A_00);
      A_local._4_4_ = 1;
    }
    else {
      iVar1 = SUNMatCopy(A,A_00);
      if (iVar1 == 0) {
        iVar1 = check_matrix(A_00,A,2.220446049250313e-15);
        if (iVar1 == 0) {
          if ((myid == 0) && (printf("    PASSED test -- SUNMatClone \n"), print_time != 0)) {
            printf("    SUNMatClone Time: %22.15e \n \n",dVar3 - dVar2);
          }
          SUNMatDestroy(A_00);
          A_local._4_4_ = 0;
        }
        else {
          printf(">>> FAILED test -- SUNMatClone, Proc %d \n",(ulong)(uint)myid);
          printf("    Failed SUNMatClone check \n \n");
          SUNMatDestroy(A_00);
          A_local._4_4_ = 1;
        }
      }
      else {
        printf(">>> FAILED test -- SUNMatCopy, Proc %d \n",(ulong)(uint)myid);
        SUNMatDestroy(A_00);
        A_local._4_4_ = 1;
      }
    }
  }
  return A_local._4_4_;
}

Assistant:

int Test_SUNMatClone(SUNMatrix A, int myid)
{
  int       failure;
  double    start_time, stop_time;
  realtype  tol=10*UNIT_ROUNDOFF;
  SUNMatrix B;

  /* clone vector */
  start_time = get_time();
  B = SUNMatClone(A);
  stop_time = get_time();

  /* check cloned matrix */
  if (B == NULL) {
    printf(">>> FAILED test -- SUNMatClone, Proc %d \n", myid);
    printf("    After SUNMatClone, B == NULL \n \n");
    return(1);
  }

  /* check cloned matrix data */
  if (!has_data(B)) {
    printf(">>> FAILED test -- SUNMatClone, Proc %d \n", myid);
    printf("    Matrix data == NULL \n \n");
    SUNMatDestroy(B);
    return(1);
  }

  failure = SUNMatCopy(A, B);
  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy, Proc %d \n", myid);
    SUNMatDestroy(B);
    return(1);
  }

  failure = check_matrix(B, A, tol);
  if (failure) {
    printf(">>> FAILED test -- SUNMatClone, Proc %d \n", myid);
    printf("    Failed SUNMatClone check \n \n");
    SUNMatDestroy(B);
    return(1);
  }

  if (myid == 0) {
    printf("    PASSED test -- SUNMatClone \n");
    PRINT_TIME("    SUNMatClone Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return(0);
}